

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.h
# Opt level: O0

void __thiscall
sentencepiece::SentencePieceText_SentencePiece::Swap
          (SentencePieceText_SentencePiece *this,SentencePieceText_SentencePiece *other)

{
  MessageLite *this_00;
  MessageLite *pMVar1;
  long in_RSI;
  long in_RDI;
  MessageLite *in_stack_00000008;
  MessageLite *in_stack_00000010;
  MessageLite *in_stack_ffffffffffffffe0;
  
  if (in_RSI != in_RDI) {
    this_00 = (MessageLite *)google::protobuf::MessageLite::GetArena(in_stack_ffffffffffffffe0);
    pMVar1 = (MessageLite *)google::protobuf::MessageLite::GetArena(this_00);
    if (this_00 == pMVar1) {
      InternalSwap(this,other);
    }
    else {
      google::protobuf::internal::GenericSwap(in_stack_00000010,in_stack_00000008);
    }
  }
  return;
}

Assistant:

inline void Swap(SentencePieceText_SentencePiece* other) {
    if (other == this) return;
    if (GetArena() == other->GetArena()) {
      InternalSwap(other);
    } else {
      ::PROTOBUF_NAMESPACE_ID::internal::GenericSwap(this, other);
    }
  }